

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.cpp
# Opt level: O0

uint8_t __thiscall Emulator::wait_for_key_press(Emulator *this)

{
  bool bVar1;
  byte local_39;
  reference local_30;
  int local_1c;
  Emulator *pEStack_18;
  int i;
  Emulator *this_local;
  
  pEStack_18 = this;
  while( true ) {
    bVar1 = std::bitset<16UL>::none(&this->keys);
    local_39 = 0;
    if (bVar1) {
      local_39 = this->running;
    }
    if ((local_39 & 1) == 0) break;
    update_keys(this);
  }
  local_1c = 0;
  while( true ) {
    if (0xf < local_1c) {
      return 0xff;
    }
    std::bitset<16UL>::operator[]((bitset<16UL> *)&local_30,(size_t)&this->keys);
    bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&local_30);
    std::bitset<16UL>::reference::~reference(&local_30);
    if (bVar1) break;
    local_1c = local_1c + 1;
  }
  return (uint8_t)local_1c;
}

Assistant:

uint8_t Emulator::wait_for_key_press(){
	while (keys.none() && running)
		update_keys();
	for (int i = 0; i < 16; i++)
		if (keys[i])
			return i;
	
	// We get here if `running` was cleared. Doesn't matter, we're exiting.
	return -1;
}